

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O0

char * __thiscall Fl_GTK_File_Chooser::filename(Fl_GTK_File_Chooser *this)

{
  gboolean gVar1;
  char *nm;
  GSList *iter;
  Fl_GTK_File_Chooser *this_local;
  
  if (this->gtkw_ptr == (GtkWidget *)0x0) {
    this_local = (Fl_GTK_File_Chooser *)0x28311c;
  }
  else {
    gVar1 = (*fl_gtk_file_chooser_get_select_multiple)((GtkFileChooser *)this->gtkw_ptr);
    if (gVar1 == 0) {
      this_local = (Fl_GTK_File_Chooser *)this->gtkw_filename;
    }
    else {
      this_local = *this->gtkw_slist;
    }
  }
  return (char *)this_local;
}

Assistant:

const char *Fl_GTK_File_Chooser::filename() const
{
  if(gtkw_ptr) {
    if(fl_gtk_file_chooser_get_select_multiple((GtkFileChooser *)gtkw_ptr) == FALSE) {
      return gtkw_filename;
    }
    else {
      GSList *iter = (GSList *)gtkw_slist;
      char *nm = (char *)iter->data;
      return nm;
    }
  }
  return("");
}